

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qabstractanimation_p.cpp
# Opt level: O1

void QAnimationTimer::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QObjectData *b;
  QUnifiedTimer *this;
  QAbstractAnimationTimer *unaff_RBX;
  bool bVar1;
  
  if (_c == InvokeMetaMethod) {
    if (_id == 1) {
      *(undefined1 *)((long)&_o[2]._vptr_QObject + 6) = 0;
      if (*(char *)((long)&_o[2]._vptr_QObject + 5) == '\x01') {
        bVar1 = _o[5]._vptr_QObject != (_func_int **)0x0;
      }
      else {
        bVar1 = false;
      }
      if ((!bVar1) && (_o[3].d_ptr.d == (QObjectData *)0x0)) {
        QUnifiedTimer::resumeAnimationTimer((QAbstractAnimationTimer *)0x3ad871);
        QUnifiedTimer::stopAnimationTimer(unaff_RBX);
        _o[1].d_ptr.d = (QObjectData *)0x0;
      }
      return;
    }
    if (_id == 0) {
      if (*(char *)((long)&_o[2]._vptr_QObject + 5) == '\x01') {
        *(undefined1 *)((long)&_o[2]._vptr_QObject + 5) = 0;
        this = QUnifiedTimer::instance(true);
        QUnifiedTimer::maybeUpdateAnimationsToCurrentTime((QUnifiedTimer *)this);
        b = _o[4].d_ptr.d;
        QtPrivate::QCommonArrayOps<QAbstractAnimation_*>::growAppend
                  ((QCommonArrayOps<QAbstractAnimation_*> *)&_o[2].d_ptr,(QAbstractAnimation **)b,
                   (QAbstractAnimation **)(&b->_vptr_QObjectData + (long)_o[5]._vptr_QObject));
        QList<QAbstractAnimation_*>::clear((QList<QAbstractAnimation_*> *)(_o + 4));
        if (_o[3].d_ptr.d != (QObjectData *)0x0) {
          (*_o->_vptr_QObject[0xd])(_o);
          return;
        }
      }
      return;
    }
  }
  return;
}

Assistant:

void QAnimationTimer::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QAnimationTimer *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->startAnimations(); break;
        case 1: _t->stopTimer(); break;
        default: ;
        }
    }
    (void)_a;
}